

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<long,long>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,long param,long params)

{
  string *in_RDI;
  string *in_R8;
  value_type *in_stack_ffffffffffffff68;
  string *this;
  long in_stack_ffffffffffffffc8;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<long>((long)in_stack_ffffffffffffff68);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_stack_ffffffffffffff68);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x704c32);
  ConstructMessageRecursive<long>(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}